

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O0

bool test_Player_getDiceRoller(bool verbose)

{
  bool bVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this;
  Hand *this_00;
  Player *pPVar2;
  DiceRoller *pDVar3;
  size_type sVar4;
  ostream *poVar5;
  bool local_1b1;
  undefined1 local_190 [16];
  ostream_iterator<int,_char,_std::char_traits<char>_> local_180;
  ostream_iterator<int,_char,_std::char_traits<char>_> *local_170;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_168;
  vector<int,_std::allocator<int>_> local_160;
  undefined1 local_148 [16];
  ostream_iterator<int,_char,_std::char_traits<char>_> local_138;
  ostream_iterator<int,_char,_std::char_traits<char>_> *local_128;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_120;
  vector<int,_std::allocator<int>_> local_118;
  undefined1 local_100 [16];
  ostream_iterator<int,_char,_std::char_traits<char>_> local_f0;
  ostream_iterator<int,_char,_std::char_traits<char>_> *local_e0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_d8;
  undefined1 local_d0 [8];
  vector<int,_std::allocator<int>_> rolls;
  vector<double,_std::allocator<double>_> local_b0;
  byte local_91;
  vector<int,_std::allocator<int>_> local_90;
  byte local_71;
  vector<int,_std::allocator<int>_> local_70;
  vector<int,_std::allocator<int>_> local_58;
  Player *local_40;
  Player *player1;
  DiceRoller *diceRoller;
  Hand *local_20;
  Hand *cards;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *ownedCountries1;
  bool success;
  bool verbose_local;
  
  ownedCountries1._6_1_ = 1;
  ownedCountries1._7_1_ = verbose;
  this = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (this->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector(this);
  cards = (Hand *)this;
  this_00 = (Hand *)operator_new(8);
  Hand::Hand(this_00);
  local_20 = this_00;
  pPVar2 = (Player *)operator_new(0x10);
  DiceRoller::DiceRoller((DiceRoller *)pPVar2);
  player1 = pPVar2;
  pPVar2 = (Player *)operator_new(0x38);
  Player::Player(pPVar2,(vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)cards,local_20,
                 (DiceRoller *)player1,1);
  local_40 = pPVar2;
  pDVar3 = Player::getDiceRoller(pPVar2);
  DiceRoller::roll(&local_58,pDVar3,1);
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(&local_58);
  local_71 = 0;
  local_91 = 0;
  rolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  local_1b1 = true;
  if (!bVar1) {
    pDVar3 = Player::getDiceRoller(local_40);
    DiceRoller::roll(&local_70,pDVar3,2);
    local_71 = 1;
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_70);
    local_1b1 = true;
    if (sVar4 == 2) {
      pDVar3 = Player::getDiceRoller(local_40);
      DiceRoller::getHistory(&local_90,pDVar3);
      local_91 = 1;
      bVar1 = std::vector<int,_std::allocator<int>_>::empty(&local_90);
      local_1b1 = true;
      if (!bVar1) {
        pDVar3 = Player::getDiceRoller(local_40);
        DiceRoller::getPercentages(&local_b0,pDVar3);
        rolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._7_1_ = 1;
        local_1b1 = std::vector<double,_std::allocator<double>_>::empty(&local_b0);
      }
    }
  }
  if ((rolls.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._7_1_ & 1) != 0) {
    std::vector<double,_std::allocator<double>_>::~vector(&local_b0);
  }
  if ((local_91 & 1) != 0) {
    std::vector<int,_std::allocator<int>_>::~vector(&local_90);
  }
  if ((local_71 & 1) != 0) {
    std::vector<int,_std::allocator<int>_>::~vector(&local_70);
  }
  std::vector<int,_std::allocator<int>_>::~vector(&local_58);
  if (local_1b1 != false) {
    ownedCountries1._6_1_ = 0;
  }
  if ((ownedCountries1._7_1_ & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<(poVar5,"\x1b[35m");
    std::operator<<((ostream *)&std::cout,"player1 rolled ");
    pDVar3 = Player::getDiceRoller(local_40);
    DiceRoller::roll((vector<int,_std::allocator<int>_> *)local_d0,pDVar3,1);
    local_d8._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_d0);
    local_e0 = (ostream_iterator<int,_char,_std::char_traits<char>_> *)
               std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_d0);
    std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
              (&local_f0,(ostream_type *)&std::cout);
    std::
    copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_100,local_d8
               ,local_e0);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"player1 rolled ");
    pDVar3 = Player::getDiceRoller(local_40);
    DiceRoller::roll(&local_118,pDVar3,2);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)local_d0,&local_118);
    std::vector<int,_std::allocator<int>_>::~vector(&local_118);
    local_120._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_d0);
    local_128 = (ostream_iterator<int,_char,_std::char_traits<char>_> *)
                std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_d0);
    std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
              (&local_138,(ostream_type *)&std::cout);
    std::
    copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_148,
               local_120,local_128);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"player1 rolled ");
    pDVar3 = Player::getDiceRoller(local_40);
    DiceRoller::roll(&local_160,pDVar3,3);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)local_d0,&local_160);
    std::vector<int,_std::allocator<int>_>::~vector(&local_160);
    local_168._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_d0);
    local_170 = (ostream_iterator<int,_char,_std::char_traits<char>_> *)
                std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_d0);
    std::ostream_iterator<int,_char,_std::char_traits<char>_>::ostream_iterator
              (&local_180,(ostream_type *)&std::cout);
    std::
    copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_190,
               local_168,local_170);
    std::operator<<((ostream *)&std::cout,"\x1b[31m\n");
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_d0);
  }
  pPVar2 = local_40;
  if (local_40 != (Player *)0x0) {
    Player::~Player(local_40);
    operator_delete(pPVar2,0x38);
  }
  return (bool)(ownedCountries1._6_1_ & 1);
}

Assistant:

bool test_Player_getDiceRoller(bool verbose = false) {

    // Arrange
    bool success = true;
    auto* ownedCountries1 = new std::vector<Map::Country*>();
    auto* cards = new Hand();
    auto* diceRoller = new DiceRoller();

    // Act
    auto* player1 = new Player(ownedCountries1, cards, diceRoller, 1);

    // Assert
    if (player1->getDiceRoller()->roll(1).empty()
        || player1->getDiceRoller()->roll(2).size() != 2
        || player1->getDiceRoller()->getHistory().empty()
        || player1->getDiceRoller()->getPercentages().empty()) {

        success = false;
    }

    if (verbose) {
        std::cout << "\n" << "\033[35m";
        std::cout << "player1 rolled ";
        std::vector<int> rolls = player1->getDiceRoller()->roll(1);
        std::copy(rolls.begin(), rolls.end(), std::ostream_iterator<int>(std::cout));
        std::cout << std::endl;
        std::cout << "player1 rolled ";
        rolls = player1->getDiceRoller()->roll(2);
        std::copy(rolls.begin(), rolls.end(), std::ostream_iterator<int>(std::cout));
        std::cout << std::endl;
        std::cout << "player1 rolled ";
        rolls = player1->getDiceRoller()->roll(3);
        std::copy(rolls.begin(), rolls.end(), std::ostream_iterator<int>(std::cout));
        std::cout << "\033[31m\n";
    }
    delete player1;
    return success;
}